

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O0

int __thiscall
ary::TemplatePlaneVerifier::verify
          (TemplatePlaneVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  PlanarLocalization *pPVar1;
  CameraModel *pCVar2;
  _OutputArray *p_Var3;
  undefined8 extraout_RAX;
  double dVar4;
  double match_score;
  double local_448;
  _InputArray local_440;
  _InputArray local_428;
  _OutputArray local_410;
  _InputArray local_3f8;
  undefined1 local_3e0 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> mask_points;
  Point_<float> local_3c0;
  Point_<float> local_3b8;
  Point_<float> local_3b0;
  undefined1 local_3a8 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> bounds_points;
  MatSize local_370;
  _InputArray local_368;
  _OutputArray local_350;
  _InputArray local_338;
  undefined1 local_320 [8];
  Mat verification;
  _InputArray local_2a8;
  undefined1 local_290 [8];
  Mat homography;
  Point_<float> local_228;
  Point_<float> local_220;
  Point_<float> local_218;
  undefined1 local_210 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> template_points;
  undefined1 local_1e0 [112];
  _InputArray local_170;
  undefined1 local_158 [56];
  _InputArray local_120;
  undefined1 local_108 [12];
  Matx<float,_3,_1> local_fc;
  _InputArray local_f0;
  Matx<float,_3,_1> local_d8 [2];
  _InputArray local_c0;
  _InputArray local_a8;
  undefined1 local_90 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  Point3_<float> local_6c;
  Point3_<float> local_60 [2];
  Point3_<float> local_44;
  undefined1 local_38 [8];
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> model_points;
  SharedPlanarLocalization *localization_local;
  Mat *image_local;
  TemplatePlaneVerifier *this_local;
  
  model_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)sig;
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38);
  cv::Point3_<float>::Point3_(&local_44,0.0,0.0,0.0);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38,&local_44)
  ;
  cv::Point3_<float>::Point3_(local_60,(float)(this->model_size).width,0.0,0.0);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38,local_60);
  cv::Point3_<float>::Point3_
            (&local_6c,(float)(this->model_size).width,(float)(this->model_size).height,0.0);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38,&local_6c)
  ;
  cv::Point3_<float>::Point3_
            ((Point3_<float> *)
             &image_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,(float)(this->model_size).height,0.0);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38,
             (value_type *)
             &image_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_90);
  cv::_InputArray::_InputArray<cv::Point3_<float>>
            (&local_a8,(vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38)
  ;
  pPVar1 = cv::Ptr<ary::PlanarLocalization>::operator->
                     ((Ptr<ary::PlanarLocalization> *)
                      model_points.
                      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(pPVar1->super_Localization)._vptr_Localization[2])(local_d8);
  cv::_InputArray::_InputArray<float,3,1>(&local_c0,local_d8);
  pPVar1 = cv::Ptr<ary::PlanarLocalization>::operator->
                     ((Ptr<ary::PlanarLocalization> *)
                      model_points.
                      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(pPVar1->super_Localization)._vptr_Localization[2])(local_108);
  cv::_InputArray::_InputArray<float,3,1>(&local_f0,&local_fc);
  CameraUser::getCameraModel((CameraUser *)local_158);
  pCVar2 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_158);
  CameraModel::getIntrinsics((Matx33f *)(local_158 + 0x14),pCVar2);
  cv::_InputArray::_InputArray<float,3,3>(&local_120,(Matx<float,_3,_3> *)(local_158 + 0x14));
  CameraUser::getCameraModel((CameraUser *)local_1e0);
  pCVar2 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_1e0);
  CameraModel::getDistortion((Mat *)(local_1e0 + 0x10),pCVar2);
  cv::_InputArray::_InputArray(&local_170,(Mat *)(local_1e0 + 0x10));
  cv::_OutputArray::_OutputArray<cv::Point_<float>>
            ((_OutputArray *)
             &template_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_90);
  p_Var3 = (_OutputArray *)cv::noArray();
  cv::projectPoints(&local_a8,&local_c0,&local_f0,&local_120,&local_170,
                    (_OutputArray *)
                    &template_points.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,p_Var3,0.0);
  cv::_OutputArray::~_OutputArray
            ((_OutputArray *)
             &template_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_170);
  cv::Mat::~Mat((Mat *)(local_1e0 + 0x10));
  cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_1e0);
  cv::_InputArray::~_InputArray(&local_120);
  cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_158);
  cv::_InputArray::~_InputArray(&local_f0);
  cv::_InputArray::~_InputArray(&local_c0);
  cv::_InputArray::~_InputArray(&local_a8);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210);
  cv::Point_<float>::Point_(&local_218,0.0,0.0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210,&local_218)
  ;
  cv::Point_<float>::Point_(&local_220,(float)(this->model_template).cols,0.0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210,&local_220)
  ;
  cv::Point_<float>::Point_
            (&local_228,(float)(this->model_template).cols,(float)(this->model_template).rows);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210,&local_228)
  ;
  cv::Point_<float>::Point_
            ((Point_<float> *)(homography.step.buf + 1),0.0,(float)(this->model_template).rows);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210,
             (value_type *)(homography.step.buf + 1));
  cv::_InputArray::_InputArray<cv::Point_<float>>
            (&local_2a8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_90);
  cv::_InputArray::_InputArray<cv::Point_<float>>
            ((_InputArray *)(verification.step.buf + 1),
             (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210);
  cv::getPerspectiveTransform((_InputArray *)local_290,&local_2a8,(int)&verification + 0x58);
  cv::_InputArray::~_InputArray((_InputArray *)(verification.step.buf + 1));
  cv::_InputArray::~_InputArray(&local_2a8);
  cv::Mat::Mat((Mat *)local_320);
  cv::_InputArray::_InputArray(&local_338,(Mat *)ctx);
  cv::_OutputArray::_OutputArray(&local_350,(Mat *)local_320);
  cv::_InputArray::_InputArray(&local_368,(Mat *)local_290);
  cv::MatSize::operator()(&local_370);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)
             &bounds_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::warpPerspective(&local_338,&local_350,&local_368,&local_370,1,0,
                      &bounds_points.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_368);
  cv::_OutputArray::~_OutputArray(&local_350);
  cv::_InputArray::~_InputArray(&local_338);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8);
  cv::Point_<float>::Point_(&local_3b0,0.0,0.0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8,&local_3b0)
  ;
  cv::Point_<float>::Point_(&local_3b8,(float)*(int *)(ctx + 0xc),0.0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8,&local_3b8)
  ;
  cv::Point_<float>::Point_(&local_3c0,(float)*(int *)(ctx + 0xc),(float)*(int *)(ctx + 8));
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8,&local_3c0)
  ;
  cv::Point_<float>::Point_
            ((Point_<float> *)
             &mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0.0,(float)*(int *)(ctx + 8));
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8,
             (value_type *)
             &mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3e0);
  cv::_InputArray::_InputArray<cv::Point_<float>>
            (&local_3f8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8)
  ;
  cv::_OutputArray::_OutputArray<cv::Point_<float>>
            (&local_410,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3e0)
  ;
  cv::_InputArray::_InputArray(&local_428,(Mat *)local_290);
  cv::perspectiveTransform(&local_3f8,&local_410,&local_428);
  cv::_InputArray::~_InputArray(&local_428);
  cv::_OutputArray::~_OutputArray(&local_410);
  cv::_InputArray::~_InputArray(&local_3f8);
  local_448 = 0.0;
  cv::_InputArray::_InputArray(&local_440,&local_448);
  cv::noArray();
  cv::Mat::setTo((_InputArray *)&this->model_mask,&local_440);
  cv::_InputArray::~_InputArray(&local_440);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&match_score,255.0);
  fillPolygon(&this->model_mask,
              (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3e0,
              (Scalar *)&match_score);
  dVar4 = match_template(this,&this->model_template,(Mat *)local_320,&this->model_mask);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3e0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_3a8);
  cv::Mat::~Mat((Mat *)local_320);
  cv::Mat::~Mat((Mat *)local_290);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_210);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_90);
  std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)local_38);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),0.4 < dVar4);
}

Assistant:

bool TemplatePlaneVerifier::verify(const Mat& image, const SharedPlanarLocalization& localization) {

	vector<Point3f> model_points;
	model_points.push_back(Point3f(0, 0, 0));
	model_points.push_back(Point3f(model_size.width, 0, 0));
	model_points.push_back(Point3f(model_size.width, model_size.height, 0));
	model_points.push_back(Point3f(0, model_size.height, 0));

	vector<Point2f> image_points;
	projectPoints(model_points, localization->getCameraPosition().rotation, localization->getCameraPosition().translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points);

	vector<Point2f> template_points;
	template_points.push_back(Point2f(0, 0));
	template_points.push_back(Point2f(model_template.cols, 0));
	template_points.push_back(Point2f(model_template.cols, model_template.rows));
	template_points.push_back(Point2f(0, model_template.rows));

	Mat homography = getPerspectiveTransform(image_points, template_points);

	Mat verification;
	cv::warpPerspective(image, verification, homography, model_template.size());

	vector<Point2f> bounds_points;
	bounds_points.push_back(Point2f(0, 0));
	bounds_points.push_back(Point2f(image.cols, 0));
	bounds_points.push_back(Point2f(image.cols, image.rows));
	bounds_points.push_back(Point2f(0, image.rows));
	vector<Point2f> mask_points;

	perspectiveTransform(bounds_points, mask_points, homography);

	model_mask.setTo(0);

	fillPolygon(model_mask, mask_points, Scalar(255));

	double match_score = match_template(model_template, verification, model_mask);

	return (match_score > 0.4);

}